

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_ntri_with_tet_nodes(REF_CELL ref_cell,REF_INT *nodes,REF_INT *ntri)

{
  uint uVar1;
  uint uVar2;
  REF_INT cell;
  int local_3c;
  REF_INT local_38;
  REF_INT RStack_34;
  REF_INT local_30;
  
  *ntri = 0;
  local_38 = (REF_INT)*(undefined8 *)(nodes + 1);
  RStack_34 = (REF_INT)((ulong)*(undefined8 *)(nodes + 1) >> 0x20);
  local_30 = nodes[3];
  uVar1 = ref_cell_with(ref_cell,&local_38,&local_3c);
  if ((uVar1 == 0) || (uVar1 == 5)) {
    if (local_3c != -1) {
      *ntri = *ntri + 1;
    }
    local_38 = *nodes;
    RStack_34 = (REF_INT)*(undefined8 *)(nodes + 2);
    local_30 = (REF_INT)((ulong)*(undefined8 *)(nodes + 2) >> 0x20);
    uVar2 = ref_cell_with(ref_cell,&local_38,&local_3c);
    if ((uVar2 != 0) && (uVar2 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x48a,
             "ref_cell_ntri_with_tet_nodes",(ulong)uVar2,"t0");
      uVar1 = uVar2;
    }
    if ((uVar2 == 5) || (uVar2 == 0)) {
      if (local_3c != -1) {
        *ntri = *ntri + 1;
      }
      local_38 = *nodes;
      RStack_34 = nodes[3];
      local_30 = nodes[1];
      uVar2 = ref_cell_with(ref_cell,&local_38,&local_3c);
      if ((uVar2 != 0) && (uVar2 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x490,"ref_cell_ntri_with_tet_nodes",(ulong)uVar2,"t0");
        uVar1 = uVar2;
      }
      if ((uVar2 == 5) || (uVar2 == 0)) {
        if (local_3c != -1) {
          *ntri = *ntri + 1;
        }
        local_38 = (REF_INT)*(undefined8 *)nodes;
        RStack_34 = (REF_INT)((ulong)*(undefined8 *)nodes >> 0x20);
        local_30 = nodes[2];
        uVar2 = ref_cell_with(ref_cell,&local_38,&local_3c);
        if ((uVar2 != 0) && (uVar2 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x496,"ref_cell_ntri_with_tet_nodes",(ulong)uVar2,"t0");
          uVar1 = uVar2;
        }
        if (((uVar2 == 5) || (uVar2 == 0)) && (uVar1 = 0, local_3c != -1)) {
          *ntri = *ntri + 1;
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x484,
           "ref_cell_ntri_with_tet_nodes",(ulong)uVar1,"t0");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_ntri_with_tet_nodes(REF_CELL ref_cell,
                                                REF_INT *nodes, REF_INT *ntri) {
  REF_INT face[3], cell;

  *ntri = 0;

  face[0] = nodes[1];
  face[1] = nodes[2];
  face[2] = nodes[3];
  RXS(ref_cell_with(ref_cell, face, &cell), REF_NOT_FOUND, "t0");
  if (REF_EMPTY != cell) (*ntri)++;

  face[0] = nodes[0];
  face[1] = nodes[2];
  face[2] = nodes[3];
  RXS(ref_cell_with(ref_cell, face, &cell), REF_NOT_FOUND, "t0");
  if (REF_EMPTY != cell) (*ntri)++;

  face[0] = nodes[0];
  face[1] = nodes[3];
  face[2] = nodes[1];
  RXS(ref_cell_with(ref_cell, face, &cell), REF_NOT_FOUND, "t0");
  if (REF_EMPTY != cell) (*ntri)++;

  face[0] = nodes[0];
  face[1] = nodes[1];
  face[2] = nodes[2];
  RXS(ref_cell_with(ref_cell, face, &cell), REF_NOT_FOUND, "t0");
  if (REF_EMPTY != cell) (*ntri)++;

  return REF_SUCCESS;
}